

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlParserInputPtr resolveEntitySplit(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  void *ctx_local;
  
  if (((ctx == (void *)0x0) || (*(long *)((long)ctx + 0x10) == 0)) ||
     (*(long *)(*(long *)((long)ctx + 0x10) + 0x20) == 0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = (void *)(**(code **)(*(long *)((long)ctx + 0x10) + 0x20))
                                  (*(undefined8 *)((long)ctx + 0x20),publicId,systemId);
  }
  return (xmlParserInputPtr)ctx_local;
}

Assistant:

static xmlParserInputPtr
resolveEntitySplit(void *ctx, const xmlChar *publicId, const xmlChar *systemId)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->resolveEntity != NULL))
	return(ctxt->user_sax->resolveEntity(ctxt->user_data, publicId,
	                                     systemId));
    return(NULL);
}